

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

void address_space_stb_riscv32
               (uc_struct_conflict12 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion_conflict *mr;
  undefined1 *puVar2;
  hwaddr addr1;
  hwaddr l;
  hwaddr local_30 [2];
  
  local_30[1] = 1;
  mr = flatview_translate_riscv32(uc,as->current_map,addr,local_30,local_30 + 1,true,attrs);
  if ((mr->ram == true) && (mr->readonly != true)) {
    puVar2 = (undefined1 *)qemu_map_ram_ptr_riscv32(mr->uc,mr->ram_block,local_30[0]);
    *puVar2 = (char)val;
    MVar1 = 0;
  }
  else {
    MVar1 = memory_region_dispatch_write_riscv32(uc,mr,local_30[0],(ulong)val,MO_8,attrs);
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stb, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (!memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stb_p(ptr, val);
        invalidate_and_set_dirty(mr, addr1, 1);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}